

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O3

void __thiscall irr::scene::CAnimatedMeshSceneNode::beginTransition(CAnimatedMeshSceneNode *this)

{
  pointer *ppCVar1;
  iterator __position;
  pointer pCVar2;
  pointer ppIVar3;
  ulong uVar4;
  u32 n;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  CMatrix4<float> local_70;
  
  if (this->JointsUsed == true) {
    if (this->TransitionTime != 0) {
      uVar6 = (ulong)((long)(this->PretransitingSave).m_data.
                            super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->PretransitingSave).m_data.
                           super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6;
      ppIVar3 = (this->JointChildSceneNodes).m_data.
                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->JointChildSceneNodes).m_data.
                    super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3;
      if ((uint)uVar6 < (uint)(uVar4 >> 3)) {
        do {
          local_70.M[9] = 0.0;
          local_70.M[0xb] = 0.0;
          local_70.M[0xc] = 0.0;
          local_70.M[6] = 0.0;
          local_70.M[7] = 0.0;
          local_70.M[8] = 0.0;
          local_70.M[1] = 0.0;
          local_70.M[2] = 0.0;
          local_70.M[3] = 0.0;
          local_70.M[4] = 0.0;
          local_70.M[0xd] = 0.0;
          local_70.M[0xe] = 0.0;
          local_70.M[0xf] = 1.0;
          local_70.M[10] = 1.0;
          local_70.M[5] = 1.0;
          local_70.M[0] = 1.0;
          __position._M_current =
               (this->PretransitingSave).m_data.
               super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->PretransitingSave).m_data.
              super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<irr::core::CMatrix4<float>,std::allocator<irr::core::CMatrix4<float>>>::
            _M_realloc_insert<irr::core::CMatrix4<float>>
                      ((vector<irr::core::CMatrix4<float>,std::allocator<irr::core::CMatrix4<float>>>
                        *)&this->PretransitingSave,__position,&local_70);
          }
          else {
            (__position._M_current)->M[0xc] = 0.0;
            (__position._M_current)->M[0xd] = 0.0;
            (__position._M_current)->M[0xe] = 0.0;
            (__position._M_current)->M[0xf] = 1.0;
            (__position._M_current)->M[8] = 0.0;
            (__position._M_current)->M[9] = 0.0;
            (__position._M_current)->M[10] = 1.0;
            (__position._M_current)->M[0xb] = 0.0;
            (__position._M_current)->M[4] = 0.0;
            (__position._M_current)->M[5] = 1.0;
            (__position._M_current)->M[6] = 0.0;
            (__position._M_current)->M[7] = 0.0;
            (__position._M_current)->M[0] = 1.0;
            (__position._M_current)->M[1] = 0.0;
            (__position._M_current)->M[2] = 0.0;
            (__position._M_current)->M[3] = 0.0;
            ppCVar1 = &(this->PretransitingSave).m_data.
                       super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          (this->PretransitingSave).is_sorted = false;
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          ppIVar3 = (this->JointChildSceneNodes).m_data.
                    super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = (long)(this->JointChildSceneNodes).m_data.
                        super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3;
        } while (uVar5 < (uint)(uVar4 >> 3));
      }
      if ((int)(uVar4 >> 3) != 0) {
        lVar7 = 0;
        uVar4 = 0;
        do {
          (**(code **)(**(long **)((long)ppIVar3 + lVar7) + 0x58))(&local_70);
          pCVar2 = (this->PretransitingSave).m_data.
                   super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)(pCVar2->M + lVar7 * 2U + 0xc) = CONCAT44(local_70.M[0xd],local_70.M[0xc]);
          *(ulong *)((long)(pCVar2->M + lVar7 * 2U + 0xc) + 8) =
               CONCAT44(local_70.M[0xf],local_70.M[0xe]);
          *(ulong *)(pCVar2->M + lVar7 * 2U + 8) = CONCAT44(local_70.M[9],local_70.M[8]);
          *(ulong *)((long)(pCVar2->M + lVar7 * 2U + 8) + 8) =
               CONCAT44(local_70.M[0xb],local_70.M[10]);
          *(ulong *)(pCVar2->M + lVar7 * 2U + 4) = CONCAT44(local_70.M[5],local_70.M[4]);
          *(ulong *)((long)(pCVar2->M + lVar7 * 2U + 4) + 8) = CONCAT44(local_70.M[7],local_70.M[6])
          ;
          *(ulong *)(pCVar2->M + lVar7 * 2) = CONCAT44(local_70.M[1],local_70.M[0]);
          *(ulong *)(pCVar2->M + lVar7 * 2 + 2) = CONCAT44(local_70.M[3],local_70.M[2]);
          uVar4 = uVar4 + 1;
          ppIVar3 = (this->JointChildSceneNodes).m_data.
                    super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 8;
        } while (uVar4 < ((ulong)((long)(this->JointChildSceneNodes).m_data.
                                        super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3)
                          >> 3 & 0xffffffff));
      }
      this->Transiting = (f32)(1.0 / (float)this->TransitionTime);
    }
    this->TransitingBlend = 0.0;
  }
  return;
}

Assistant:

void CAnimatedMeshSceneNode::beginTransition()
{
	if (!JointsUsed)
		return;

	if (TransitionTime != 0) {
		// Check the array is big enough
		if (PretransitingSave.size() < JointChildSceneNodes.size()) {
			for (u32 n = PretransitingSave.size(); n < JointChildSceneNodes.size(); ++n)
				PretransitingSave.push_back(core::matrix4());
		}

		// Copy the position of joints
		for (u32 n = 0; n < JointChildSceneNodes.size(); ++n)
			PretransitingSave[n] = JointChildSceneNodes[n]->getRelativeTransformation();

		Transiting = core::reciprocal((f32)TransitionTime);
	}
	TransitingBlend = 0.f;
}